

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall Assimp::HMPImporter::CreateOutputFaceList(HMPImporter *this,uint width,uint height)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  int iVar4;
  float fVar5;
  ulong *puVar6;
  aiFace *paVar7;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  uint *puVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  aiVector3D *paVar14;
  ulong uVar15;
  aiVector3D *paVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  aiVector3D *paVar20;
  aiFace *paVar21;
  
  paVar1 = *((this->super_MDLImporter).pScene)->mMeshes;
  uVar19 = (height - 1) * (width - 1);
  uVar15 = (ulong)uVar19;
  paVar1->mNumFaces = uVar19;
  puVar6 = (ulong *)operator_new__(uVar15 * 0x10 + 8);
  *puVar6 = uVar15;
  paVar21 = (aiFace *)(puVar6 + 1);
  if (uVar19 != 0) {
    paVar7 = paVar21;
    do {
      paVar7->mNumIndices = 0;
      paVar7->mIndices = (uint *)0x0;
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar21 + uVar15);
  }
  paVar1->mFaces = paVar21;
  uVar19 = uVar19 * 4;
  paVar1->mNumVertices = uVar19;
  uVar15 = (ulong)uVar19 * 0xc;
  __s = (aiVector3D *)operator_new__(uVar15);
  if (uVar19 != 0) {
    memset(__s,0,((uVar15 - 0xc) - (uVar15 - 0xc) % 0xc) + 0xc);
  }
  __s_00 = (aiVector3D *)operator_new__(uVar15);
  if (uVar19 != 0) {
    memset(__s_00,0,((uVar15 - 0xc) - (uVar15 - 0xc) % 0xc) + 0xc);
  }
  if (paVar1->mTextureCoords[0] == (aiVector3D *)0x0) {
    __s_01 = (aiVector3D *)0x0;
  }
  else {
    __s_01 = (aiVector3D *)operator_new__(uVar15);
    if (uVar19 != 0) {
      memset(__s_01,0,((uVar15 - 0xc) - (uVar15 - 0xc) % 0xc) + 0xc);
    }
  }
  iVar18 = 0;
  iVar10 = 0;
  paVar14 = __s_01;
  paVar16 = __s;
  paVar20 = __s_00;
  while (iVar10 != height - 1) {
    iVar12 = iVar10 * width;
    iVar10 = iVar10 + 1;
    for (uVar15 = 0; uVar15 != width - 1; uVar15 = uVar15 + 1) {
      paVar21->mNumIndices = 4;
      puVar8 = (uint *)operator_new__(0x10);
      paVar21->mIndices = puVar8;
      paVar2 = paVar1->mVertices;
      iVar4 = (int)uVar15;
      uVar19 = iVar12 + iVar4;
      paVar3 = paVar2 + uVar19;
      fVar5 = paVar3->y;
      paVar16->x = paVar3->x;
      paVar16->y = fVar5;
      paVar16->z = paVar2[uVar19].z;
      paVar2 = paVar1->mVertices;
      uVar11 = iVar10 * width + iVar4;
      paVar3 = paVar2 + uVar11;
      fVar5 = paVar3->y;
      paVar16[1].x = paVar3->x;
      paVar16[1].y = fVar5;
      paVar16[1].z = paVar2[uVar11].z;
      paVar2 = paVar1->mVertices;
      uVar13 = iVar10 * width + iVar4 + 1;
      paVar3 = paVar2 + uVar13;
      fVar5 = paVar3->y;
      paVar16[2].x = paVar3->x;
      paVar16[2].y = fVar5;
      paVar16[2].z = paVar2[uVar13].z;
      paVar2 = paVar1->mVertices;
      uVar17 = iVar12 + iVar4 + 1;
      paVar3 = paVar2 + uVar17;
      fVar5 = paVar3->y;
      paVar16[3].x = paVar3->x;
      paVar16[3].y = fVar5;
      paVar16[3].z = paVar2[uVar17].z;
      paVar2 = paVar1->mNormals;
      paVar3 = paVar2 + uVar19;
      fVar5 = paVar3->y;
      paVar20->x = paVar3->x;
      paVar20->y = fVar5;
      paVar20->z = paVar2[uVar19].z;
      paVar2 = paVar1->mNormals;
      paVar3 = paVar2 + uVar11;
      fVar5 = paVar3->y;
      paVar20[1].x = paVar3->x;
      paVar20[1].y = fVar5;
      paVar20[1].z = paVar2[uVar11].z;
      paVar2 = paVar1->mNormals;
      paVar3 = paVar2 + uVar13;
      fVar5 = paVar3->y;
      paVar20[2].x = paVar3->x;
      paVar20[2].y = fVar5;
      paVar20[2].z = paVar2[uVar13].z;
      paVar2 = paVar1->mNormals;
      paVar3 = paVar2 + uVar17;
      fVar5 = paVar3->y;
      paVar20[3].x = paVar3->x;
      paVar20[3].y = fVar5;
      paVar20[3].z = paVar2[uVar17].z;
      paVar3 = paVar1->mTextureCoords[0];
      if (paVar3 != (aiVector3D *)0x0) {
        paVar14->z = paVar3[uVar19].z;
        fVar5 = paVar3[uVar19].y;
        paVar14->x = paVar3[uVar19].x;
        paVar14->y = fVar5;
        paVar3 = paVar1->mTextureCoords[0];
        paVar14[1].z = paVar3[uVar11].z;
        paVar3 = paVar3 + uVar11;
        fVar5 = paVar3->y;
        paVar14[1].x = paVar3->x;
        paVar14[1].y = fVar5;
        paVar3 = paVar1->mTextureCoords[0];
        paVar14[2].z = paVar3[uVar13].z;
        paVar3 = paVar3 + uVar13;
        fVar5 = paVar3->y;
        paVar14[2].x = paVar3->x;
        paVar14[2].y = fVar5;
        paVar3 = paVar1->mTextureCoords[0];
        paVar14[3].z = paVar3[uVar17].z;
        paVar3 = paVar3 + uVar17;
        fVar5 = paVar3->y;
        paVar14[3].x = paVar3->x;
        paVar14[3].y = fVar5;
        paVar14 = paVar14 + 4;
      }
      paVar16 = paVar16 + 4;
      paVar20 = paVar20 + 4;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        paVar21->mIndices[lVar9] = iVar18 + (int)lVar9;
      }
      paVar21 = paVar21 + 1;
      iVar18 = iVar18 + 4;
    }
  }
  if (paVar1->mVertices != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mVertices);
  }
  paVar1->mVertices = __s;
  if (paVar1->mNormals != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mNormals);
  }
  paVar1->mNormals = __s_00;
  if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mTextureCoords[0]);
    paVar1->mTextureCoords[0] = __s_01;
  }
  return;
}

Assistant:

void HMPImporter::CreateOutputFaceList(unsigned int width,unsigned int height)
{
    aiMesh* const pcMesh = this->pScene->mMeshes[0];

    // Allocate enough storage
    pcMesh->mNumFaces = (width-1) * (height-1);
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

    pcMesh->mNumVertices   = pcMesh->mNumFaces*4;
    aiVector3D* pcVertices = new aiVector3D[pcMesh->mNumVertices];
    aiVector3D* pcNormals  = new aiVector3D[pcMesh->mNumVertices];

    aiFace* pcFaceOut(pcMesh->mFaces);
    aiVector3D* pcVertOut = pcVertices;
    aiVector3D* pcNorOut = pcNormals;

    aiVector3D* pcUVs = pcMesh->mTextureCoords[0] ? new aiVector3D[pcMesh->mNumVertices] : NULL;
    aiVector3D* pcUVOut(pcUVs);

    // Build the terrain square
    unsigned int iCurrent = 0;
    for (unsigned int y = 0; y < height-1;++y)  {
        for (unsigned int x = 0; x < width-1;++x,++pcFaceOut)   {
            pcFaceOut->mNumIndices = 4;
            pcFaceOut->mIndices = new unsigned int[4];

            *pcVertOut++ = pcMesh->mVertices[y*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x+1];
            *pcVertOut++ = pcMesh->mVertices[y*width+x+1];


            *pcNorOut++ = pcMesh->mNormals[y*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x+1];
            *pcNorOut++ = pcMesh->mNormals[y*width+x+1];

            if (pcMesh->mTextureCoords[0])
            {
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x+1];
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x+1];
            }

            for (unsigned int i = 0; i < 4;++i)
                pcFaceOut->mIndices[i] = iCurrent++;
        }
    }
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pcVertices;

    delete[] pcMesh->mNormals;
    pcMesh->mNormals = pcNormals;

    if (pcMesh->mTextureCoords[0])
    {
        delete[] pcMesh->mTextureCoords[0];
        pcMesh->mTextureCoords[0] = pcUVs;
    }
}